

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::CharSetLeaf::IsEqualTo(CharSetLeaf *this,uint level,CharSetNode *other)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  CharSetLeaf *otherLeaf;
  CharSetNode *other_local;
  uint level_local;
  CharSetLeaf *this_local;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x32f,"(level == 0)","level == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (other == (CharSetNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x330,"(other != nullptr)","other != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (other == (CharSetNode *)&CharSetFull::Instance) {
    this_local._7_1_ = false;
  }
  else {
    uVar3 = (*other->_vptr_CharSetNode[0xd])();
    if ((uVar3 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                         ,0x333,"(other->IsLeaf())","other->IsLeaf()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local._7_1_ = CharBitvec::IsSubsetOf(&this->vec,(CharBitvec *)(other + 1));
  }
  return this_local._7_1_;
}

Assistant:

bool CharSetLeaf::IsEqualTo(uint level, const CharSetNode* other) const
    {
        Assert(level == 0);
        Assert(other != nullptr);
        if (other == CharSetFull::TheFullNode)
            return false;
        Assert(other->IsLeaf());
        CharSetLeaf* otherLeaf = (CharSetLeaf*)other;
        return vec.IsSubsetOf(otherLeaf->vec);
    }